

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_ref.h
# Opt level: O1

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
absl::lts_20250127::functional_internal::
InvokeObject<google::protobuf::DescriptorBuilder::CheckVisibilityRules(google::protobuf::FileDescriptor*,google::protobuf::FileDescriptorProto_const&)::__1,std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,functional_internal *this,VoidPtr ptr)

{
  ushort uVar1;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> pieces;
  undefined8 local_58;
  char *local_50;
  ulong local_48;
  long local_40;
  undefined8 local_38;
  char *local_30;
  ulong local_28;
  long local_20;
  undefined8 local_18;
  char *local_10;
  
  uVar1 = **(ushort **)(**(long **)this + 8);
  local_48 = (ulong)uVar1;
  local_40 = ~local_48 + (long)*(ushort **)(**(long **)this + 8);
  local_58 = 1;
  local_50 = "\"";
  local_38 = 0x106;
  local_30 = 
  "\" is a nested enum and cannot be marked `export` with STRICT default_symbol_visibility. It must be moved to top-level, ideally in its own file in order to be `export`. For C++ namespacing of enums in a messages use: `local message <OuterNamespace> { export enum "
  ;
  local_18 = 0x1c;
  local_10 = " {...} reserved 1 to max; }`";
  pieces._M_len._0_2_ = uVar1;
  pieces._M_array = (iterator)0x5;
  pieces._M_len._2_6_ = 0;
  local_28 = local_48;
  local_20 = local_40;
  strings_internal::CatPieces_abi_cxx11_
            (__return_storage_ptr__,(strings_internal *)&local_58,pieces);
  return __return_storage_ptr__;
}

Assistant:

R InvokeObject(VoidPtr ptr, typename ForwardT<Args>::type... args) {
  auto o = static_cast<const Obj*>(ptr.obj);
  return static_cast<R>(
      absl::base_internal::invoke(*o, std::forward<Args>(args)...));
}